

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void decode_opc_special3_r6(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx)

{
  TCGContext_conflict6 *tcg_ctx_00;
  short offset;
  uint base;
  uint uVar1;
  uint rd_00;
  uint uVar2;
  uint uVar3;
  uint32_t val;
  TCGv_i32 arg3;
  TCGv_i32 helper_tmp;
  int16_t imm;
  uint32_t op2;
  uint32_t op1;
  int sa;
  int rd;
  int rt;
  int rs;
  TCGContext_conflict6 *tcg_ctx;
  DisasContext_conflict6 *ctx_local;
  CPUMIPSState_conflict8 *env_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  base = ctx->opcode >> 0x15 & 0x1f;
  uVar1 = *(ushort *)((long)&ctx->opcode + 2) & 0x1f;
  rd_00 = ctx->opcode >> 0xb & 0x1f;
  uVar2 = ctx->opcode >> 6;
  offset = (short)((uint)(int)(short)ctx->opcode >> 7);
  uVar3 = ctx->opcode & 0xfc00003f;
  switch(uVar3) {
  case 0x7c000020:
    if (rd_00 != 0) {
      uVar3 = ctx->opcode & 0xfc0007ff;
      if (uVar3 == 0x7c000020) {
        gen_bitswap(ctx,0x7c000020,rd_00,uVar1);
      }
      else if ((((uVar3 == 0x7c000220) || (uVar3 == 0x7c000260)) || (uVar3 == 0x7c0002a0)) ||
              (uVar3 == 0x7c0002e0)) {
        gen_align(ctx,0x20,rd_00,base,uVar1,uVar2 & 3);
      }
    }
    break;
  default:
    generate_exception_end(ctx,0x14);
    break;
  case 0x7c000024:
    check_mips_64(ctx);
    if (rd_00 != 0) {
      uVar3 = ctx->opcode & 0xfc0007ff;
      if (uVar3 == 0x7c000024) {
        gen_bitswap(ctx,0x7c000024,rd_00,uVar1);
      }
      else if ((((uVar3 == 0x7c000224) || (uVar3 == 0x7c000264)) || (uVar3 == 0x7c0002a4)) ||
              (((uVar3 == 0x7c0002e4 || (uVar3 == 0x7c000324)) ||
               ((uVar3 == 0x7c000364 || ((uVar3 == 0x7c0003a4 || (uVar3 == 0x7c0003e4)))))))) {
        gen_align(ctx,0x40,rd_00,base,uVar1,uVar2 & 7);
      }
    }
    break;
  case 0x7c000025:
    check_cp0_enabled(ctx);
    if ((ctx->hflags & 0x8000000) != 0) {
      gen_cache_operation(ctx,uVar1,base,offset);
    }
    break;
  case 0x7c000026:
    gen_st_cond(ctx,uVar1,base,(int)offset,MO_LESL,false);
    break;
  case 0x7c000027:
    gen_st_cond(ctx,uVar1,base,(int)offset,MO_64,false);
    break;
  case 0x7c000035:
    if (0x17 < uVar1) {
      generate_exception_end(ctx,0x14);
    }
    break;
  case 0x7c000036:
    gen_ld(ctx,uVar3,uVar1,base,(int)offset);
    break;
  case 0x7c000037:
    gen_ld(ctx,uVar3,uVar1,base,(int)offset);
    break;
  case 0x7c00003d:
    if (ctx->gi < 2) {
      generate_exception_end(ctx,0x14);
    }
    check_cp0_enabled(ctx);
    uVar1 = ctx->opcode >> 6 & 3;
    if (uVar1 != 0) {
      if (uVar1 == 2) {
        val = extract32(ctx->opcode,8,2);
        arg3 = tcg_const_i32_mips64el(tcg_ctx_00,val);
        gen_helper_ginvt(tcg_ctx_00,tcg_ctx_00->cpu_env,tcg_ctx_00->cpu_gpr[(int)base],arg3);
        tcg_temp_free_i32(tcg_ctx_00,arg3);
      }
      else {
        generate_exception_end(ctx,0x14);
      }
    }
  }
  return;
}

Assistant:

static void decode_opc_special3_r6(CPUMIPSState *env, DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rs, rt, rd, sa;
    uint32_t op1, op2;
    int16_t imm;

    rs = (ctx->opcode >> 21) & 0x1f;
    rt = (ctx->opcode >> 16) & 0x1f;
    rd = (ctx->opcode >> 11) & 0x1f;
    sa = (ctx->opcode >> 6) & 0x1f;
    imm = (int16_t)ctx->opcode >> 7;

    op1 = MASK_SPECIAL3(ctx->opcode);
    switch (op1) {
    case R6_OPC_PREF:
        if (rt >= 24) {
            /* hint codes 24-31 are reserved and signal RI */
            generate_exception_end(ctx, EXCP_RI);
        }
        /* Treat as NOP. */
        break;
    case R6_OPC_CACHE:
        check_cp0_enabled(ctx);
        if (ctx->hflags & MIPS_HFLAG_ITC_CACHE) {
            gen_cache_operation(ctx, rt, rs, imm);
        }
        break;
    case R6_OPC_SC:
        gen_st_cond(ctx, rt, rs, imm, MO_TESL, false);
        break;
    case R6_OPC_LL:
        gen_ld(ctx, op1, rt, rs, imm);
        break;
    case OPC_BSHFL:
        {
            if (rd == 0) {
                /* Treat as NOP. */
                break;
            }
            op2 = MASK_BSHFL(ctx->opcode);
            switch (op2) {
            case OPC_ALIGN:
            case OPC_ALIGN_1:
            case OPC_ALIGN_2:
            case OPC_ALIGN_3:
                gen_align(ctx, 32, rd, rs, rt, sa & 3);
                break;
            case OPC_BITSWAP:
                gen_bitswap(ctx, op2, rd, rt);
                break;
            }
        }
        break;
    case OPC_GINV:
        if (unlikely(ctx->gi <= 1)) {
            generate_exception_end(ctx, EXCP_RI);
        }
        check_cp0_enabled(ctx);
        switch ((ctx->opcode >> 6) & 3) {
        case 0:    /* GINVI */
            /* Treat as NOP. */
            break;
        case 2:    /* GINVT */
            gen_helper_0e1i(ginvt, tcg_ctx->cpu_gpr[rs], extract32(ctx->opcode, 8, 2));
            break;
        default:
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
#if defined(TARGET_MIPS64)
    case R6_OPC_SCD:
        gen_st_cond(ctx, rt, rs, imm, MO_TEQ, false);
        break;
    case R6_OPC_LLD:
        gen_ld(ctx, op1, rt, rs, imm);
        break;
    case OPC_DBSHFL:
        check_mips_64(ctx);
        {
            if (rd == 0) {
                /* Treat as NOP. */
                break;
            }
            op2 = MASK_DBSHFL(ctx->opcode);
            switch (op2) {
            case OPC_DALIGN:
            case OPC_DALIGN_1:
            case OPC_DALIGN_2:
            case OPC_DALIGN_3:
            case OPC_DALIGN_4:
            case OPC_DALIGN_5:
            case OPC_DALIGN_6:
            case OPC_DALIGN_7:
                gen_align(ctx, 64, rd, rs, rt, sa & 7);
                break;
            case OPC_DBITSWAP:
                gen_bitswap(ctx, op2, rd, rt);
                break;
            }

        }
        break;
#endif
    default:            /* Invalid */
        MIPS_INVAL("special3_r6");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
}